

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilTruth.c
# Opt level: O2

void Extra_TruthCountOnesInCofs(uint *pTruth,int nVars,short *pStore)

{
  uint uVar1;
  ulong uVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  long lVar13;
  ulong uVar14;
  short *psVar15;
  ulong uVar16;
  short *psVar17;
  uint uVar18;
  
  bVar3 = (char)nVars - 5U & 0x1f;
  uVar18 = 1 << bVar3;
  uVar2 = (long)(int)uVar18 / 2;
  uVar16 = 0;
  memset(pStore,0,(long)nVars * 4);
  if (nVars < 6) {
    if (0 < nVars) {
      uVar18 = *pTruth;
      iVar4 = Extra_WordCountOnes(uVar18 & 0x55555555);
      *pStore = (short)iVar4;
      iVar4 = Extra_WordCountOnes(uVar18 & 0xaaaaaaaa);
      pStore[1] = (short)iVar4;
      if (nVars != 1) {
        iVar4 = Extra_WordCountOnes(uVar18 & 0x33333333);
        pStore[2] = (short)iVar4;
        iVar4 = Extra_WordCountOnes(uVar18 & 0xcccccccc);
        pStore[3] = (short)iVar4;
        if (2 < (uint)nVars) {
          iVar4 = Extra_WordCountOnes(uVar18 & 0xf0f0f0f);
          pStore[4] = (short)iVar4;
          iVar4 = Extra_WordCountOnes(uVar18 & 0xf0f0f0f0);
          pStore[5] = (short)iVar4;
          if (nVars != 3) {
            iVar4 = Extra_WordCountOnes(uVar18 & 0xff00ff);
            pStore[6] = (short)iVar4;
            iVar4 = Extra_WordCountOnes(uVar18 & 0xff00ff00);
            pStore[7] = (short)iVar4;
            if (nVars == 5) {
              iVar4 = Extra_WordCountOnes(uVar18 & 0xffff);
              pStore[8] = (short)iVar4;
              iVar4 = Extra_WordCountOnes(uVar18 & 0xffff0000);
              pStore[9] = (short)iVar4;
            }
          }
        }
      }
    }
  }
  else {
    uVar14 = (ulong)uVar18;
    if (1 << bVar3 < 1) {
      uVar14 = uVar16;
    }
    for (; uVar16 != uVar14; uVar16 = uVar16 + 1) {
      iVar4 = Extra_WordCountOnes(pTruth[uVar16]);
      psVar15 = pStore + 10;
      for (lVar13 = 0; (ulong)(uint)nVars - 5 != lVar13; lVar13 = lVar13 + 1) {
        psVar17 = psVar15 + 1;
        if (((uint)uVar16 >> ((uint)lVar13 & 0x1f) & 1) == 0) {
          psVar17 = psVar15;
        }
        *psVar17 = *psVar17 + (short)iVar4;
        psVar15 = psVar15 + 2;
      }
    }
    uVar14 = 0;
    uVar16 = uVar2 & 0xffffffff;
    if ((int)uVar2 < 1) {
      uVar16 = uVar14;
    }
    iVar4 = (int)uVar16;
    if (nVars < 6) {
      iVar4 = 0;
    }
    for (; iVar4 != (int)uVar14; uVar14 = uVar14 + 1) {
      uVar18 = pTruth[uVar14 * 2];
      uVar1 = pTruth[uVar14 * 2 + 1];
      iVar5 = Extra_WordCountOnes((uVar18 & 0x55555555) + (uVar1 & 0xd5555555) * 2);
      iVar6 = Extra_WordCountOnes(uVar1 >> 1 & 0x55555555 | uVar18 & 0xaaaaaaaa);
      iVar7 = Extra_WordCountOnes((uVar18 & 0x33333333) + (uVar1 & 0xf3333333) * 4);
      iVar8 = Extra_WordCountOnes(uVar1 >> 2 & 0x33333333 | uVar18 & 0xcccccccc);
      iVar9 = Extra_WordCountOnes((uVar1 & 0xf0f0f0f) << 4 | uVar18 & 0xf0f0f0f);
      iVar10 = Extra_WordCountOnes(uVar1 >> 4 & 0xf0f0f0f | uVar18 & 0xf0f0f0f0);
      iVar11 = Extra_WordCountOnes((uVar1 & 0xff00ff) << 8 | uVar18 & 0xff00ff);
      iVar12 = Extra_WordCountOnes(uVar1 >> 8 & 0xff00ff | uVar18 & 0xff00ff00);
      *pStore = (short)iVar5 + *pStore;
      pStore[1] = (short)iVar6 + pStore[1];
      pStore[2] = (short)iVar7 + pStore[2];
      pStore[3] = (short)iVar8 + pStore[3];
      pStore[4] = (short)iVar9 + pStore[4];
      pStore[5] = (short)iVar10 + pStore[5];
      pStore[6] = (short)iVar11 + pStore[6];
      pStore[7] = (short)iVar12 + pStore[7];
      iVar5 = Extra_WordCountOnes(uVar1 << 0x10 | uVar18 & 0xffff);
      pStore[8] = pStore[8] + (short)iVar5;
      iVar5 = Extra_WordCountOnes(uVar1 >> 0x10 | uVar18 & 0xffff0000);
      pStore[9] = pStore[9] + (short)iVar5;
    }
  }
  return;
}

Assistant:

void Extra_TruthCountOnesInCofs( unsigned * pTruth, int nVars, short * pStore )
{
    int nWords = Extra_TruthWordNum( nVars );
    int i, k, Counter;
    memset( pStore, 0, sizeof(short) * 2 * nVars );
    if ( nVars <= 5 )
    {
        if ( nVars > 0 )
        {
            pStore[2*0+0] = Extra_WordCountOnes( pTruth[0] & 0x55555555 );
            pStore[2*0+1] = Extra_WordCountOnes( pTruth[0] & 0xAAAAAAAA );
        }
        if ( nVars > 1 )
        {
            pStore[2*1+0] = Extra_WordCountOnes( pTruth[0] & 0x33333333 );
            pStore[2*1+1] = Extra_WordCountOnes( pTruth[0] & 0xCCCCCCCC );
        }
        if ( nVars > 2 )
        {
            pStore[2*2+0] = Extra_WordCountOnes( pTruth[0] & 0x0F0F0F0F );
            pStore[2*2+1] = Extra_WordCountOnes( pTruth[0] & 0xF0F0F0F0 );
        }
        if ( nVars > 3 )
        {
            pStore[2*3+0] = Extra_WordCountOnes( pTruth[0] & 0x00FF00FF );
            pStore[2*3+1] = Extra_WordCountOnes( pTruth[0] & 0xFF00FF00 );
        }
        if ( nVars > 4 )
        {
            pStore[2*4+0] = Extra_WordCountOnes( pTruth[0] & 0x0000FFFF );
            pStore[2*4+1] = Extra_WordCountOnes( pTruth[0] & 0xFFFF0000 );
        }
        return;
    }
    // nVars >= 6
    // count 1's for all other variables
    for ( k = 0; k < nWords; k++ )
    {
        Counter = Extra_WordCountOnes( pTruth[k] );
        for ( i = 5; i < nVars; i++ )
            if ( k & (1 << (i-5)) )
                pStore[2*i+1] += Counter;
            else
                pStore[2*i+0] += Counter;
    }
    // count 1's for the first five variables
    for ( k = 0; k < nWords/2; k++ )
    {
        pStore[2*0+0] += Extra_WordCountOnes( (pTruth[0] & 0x55555555) | ((pTruth[1] & 0x55555555) <<  1) );
        pStore[2*0+1] += Extra_WordCountOnes( (pTruth[0] & 0xAAAAAAAA) | ((pTruth[1] & 0xAAAAAAAA) >>  1) );
        pStore[2*1+0] += Extra_WordCountOnes( (pTruth[0] & 0x33333333) | ((pTruth[1] & 0x33333333) <<  2) );
        pStore[2*1+1] += Extra_WordCountOnes( (pTruth[0] & 0xCCCCCCCC) | ((pTruth[1] & 0xCCCCCCCC) >>  2) );
        pStore[2*2+0] += Extra_WordCountOnes( (pTruth[0] & 0x0F0F0F0F) | ((pTruth[1] & 0x0F0F0F0F) <<  4) );
        pStore[2*2+1] += Extra_WordCountOnes( (pTruth[0] & 0xF0F0F0F0) | ((pTruth[1] & 0xF0F0F0F0) >>  4) );
        pStore[2*3+0] += Extra_WordCountOnes( (pTruth[0] & 0x00FF00FF) | ((pTruth[1] & 0x00FF00FF) <<  8) );
        pStore[2*3+1] += Extra_WordCountOnes( (pTruth[0] & 0xFF00FF00) | ((pTruth[1] & 0xFF00FF00) >>  8) );
        pStore[2*4+0] += Extra_WordCountOnes( (pTruth[0] & 0x0000FFFF) | ((pTruth[1] & 0x0000FFFF) << 16) );
        pStore[2*4+1] += Extra_WordCountOnes( (pTruth[0] & 0xFFFF0000) | ((pTruth[1] & 0xFFFF0000) >> 16) );
        pTruth += 2;
    }
}